

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O1

int testJSONHelpers(int param_1,char **param_2)

{
  char *pcVar1;
  pointer pMVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  Object<(anonymous_namespace)::ObjectStruct> *this;
  Value *pVVar9;
  ValueHolder VVar10;
  long lVar11;
  pointer pMVar12;
  _Any_data *name;
  undefined1 in_R8B;
  uint uVar13;
  cmJSONState state;
  Object<(anonymous_namespace)::ObjectStruct> helper;
  int i;
  string str;
  ObjectStruct s5;
  ObjectStruct s1;
  Value v;
  ObjectStruct s6;
  ObjectStruct s7;
  ObjectStruct s2;
  ObjectStruct s3;
  ObjectStruct s4;
  undefined1 local_428 [24];
  bool abStack_410 [8];
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Any_data local_3b0;
  _Manager_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [24];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Any_data local_338;
  code *local_328;
  code *pcStack_320;
  _Any_data local_318;
  code *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  ValueHolder local_2e8;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  ValueHolder local_2c0;
  char *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  int local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  undefined8 local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  ValueHolder local_278;
  ValueHolder VStack_270;
  char *local_268;
  undefined1 local_260;
  _Any_data local_258;
  code *local_248;
  char local_238;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  local_228;
  ObjectStruct local_208;
  _Any_data local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Any_data local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  code *local_148;
  undefined8 uStack_140;
  code *local_138;
  undefined8 uStack_130;
  ValueHolder local_120;
  undefined8 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Any_data local_d8;
  code *local_c8;
  _Any_data local_b8;
  code *local_a8;
  _Any_data local_98;
  code *local_88;
  InheritedStruct local_78;
  
  Json::Value::Value((Value *)&local_278,2);
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_388._0_4_ = 0;
  uVar4 = local_388._0_4_;
  local_388._0_4_ = 0;
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  local_3d0._0_8_ = &local_278;
  if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_001b41fd;
  local_338._M_unused._M_object = local_428;
  cVar5 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                    ((anonymous_namespace)::IntHelper,local_388,local_3d0,&local_338);
  if (cVar5 == '\0') {
    iVar7 = 0x55;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(IntHelper(i, &v, &state)) failed on line ",0x35);
LAB_001b1de5:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    bVar6 = false;
  }
  else {
    if (local_388._0_4_ != 2) {
      iVar7 = 0x56;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
      goto LAB_001b1de5;
    }
    local_388._0_4_ = 0;
    Json::Value::Value((Value *)local_3d0,nullValue);
    Json::Value::operator=((Value *)&local_278,(Value *)local_3d0);
    Json::Value::~Value((Value *)local_3d0);
    local_3d0._0_8_ = &local_278;
    uVar4 = local_388._0_4_;
    if ((anonymous_namespace)::IntHelper._16_8_ == 0) {
LAB_001b41fd:
      local_388._0_4_ = uVar4;
      local_338._M_unused._M_object = local_428;
      std::__throw_bad_function_call();
    }
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                      ((anonymous_namespace)::IntHelper,local_388,local_3d0,&local_338);
    if (cVar5 != '\0') {
      iVar7 = 0x5a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!IntHelper(i, &v, &state)) failed on line ",0x36
                );
      goto LAB_001b1de5;
    }
    local_388._0_4_ = 0;
    local_3d0._0_8_ = (ValueHolder *)0x0;
    uVar4 = local_388._0_4_;
    if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_001b41fd;
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                      ((anonymous_namespace)::IntHelper,local_388,local_3d0,&local_338);
    if (cVar5 == '\0') {
      iVar7 = 0x5d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(IntHelper(i, nullptr, &state)) failed on line ",
                 0x3a);
      goto LAB_001b1de5;
    }
    bVar6 = true;
    if (local_388._0_4_ != 1) {
      iVar7 = 0x5e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
      goto LAB_001b1de5;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)&local_278);
  if (!bVar6) {
    return 1;
  }
  Json::Value::Value((Value *)&local_278,2);
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_388._0_8_ = (ulong)(uint)local_388._4_4_ << 0x20;
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  local_3d0._0_8_ = &local_278;
  if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_001b4202;
  local_338._M_unused._M_object = local_428;
  cVar5 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                    ((anonymous_namespace)::UIntHelper,local_388,local_3d0,&local_338);
  if (cVar5 == '\0') {
    iVar7 = 0x68;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(UIntHelper(i, &v, &state)) failed on line ",0x36);
LAB_001b2042:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    bVar6 = false;
  }
  else {
    if (local_388._0_4_ != 2) {
      iVar7 = 0x69;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
      goto LAB_001b2042;
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffff00000000;
    Json::Value::Value((Value *)local_3d0,nullValue);
    Json::Value::operator=((Value *)&local_278,(Value *)local_3d0);
    Json::Value::~Value((Value *)local_3d0);
    local_3d0._0_8_ = &local_278;
    if ((anonymous_namespace)::UIntHelper._16_8_ == 0) {
LAB_001b4202:
      local_338._M_unused._M_object = local_428;
      std::__throw_bad_function_call();
    }
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                      ((anonymous_namespace)::UIntHelper,local_388,local_3d0,&local_338);
    if (cVar5 != '\0') {
      iVar7 = 0x6c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!UIntHelper(i, &v, &state)) failed on line ",
                 0x37);
      goto LAB_001b2042;
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffff00000000;
    local_3d0._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_001b4202;
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                      ((anonymous_namespace)::UIntHelper,local_388,local_3d0,&local_338);
    if (cVar5 == '\0') {
      iVar7 = 0x6f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(UIntHelper(i, nullptr, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b2042;
    }
    bVar6 = true;
    if (local_388._0_4_ != 1) {
      iVar7 = 0x70;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
      goto LAB_001b2042;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)&local_278);
  if (!bVar6) {
    return 1;
  }
  Json::Value::Value((Value *)&local_278,true);
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  local_3d0._0_8_ = &local_278;
  if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b4207;
  local_338._M_unused._M_object = local_428;
  cVar5 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                    ((anonymous_namespace)::BoolHelper,local_388,local_3d0,&local_338);
  if (cVar5 == '\0') {
    iVar7 = 0x7a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ",0x36);
LAB_001b22f9:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    bVar6 = false;
  }
  else {
    if (local_388[0] == '\0') {
      iVar7 = 0x7b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(b) failed on line ",0x1e);
      goto LAB_001b22f9;
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
    Json::Value::Value((Value *)local_3d0,false);
    Json::Value::operator=((Value *)&local_278,(Value *)local_3d0);
    Json::Value::~Value((Value *)local_3d0);
    local_3d0._0_8_ = &local_278;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b4207;
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_388,local_3d0,&local_338);
    if (cVar5 == '\0') {
      iVar7 = 0x7f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, &v, &state)) failed on line ",0x36
                );
      goto LAB_001b22f9;
    }
    if (local_388[0] == '\x01') {
      iVar7 = 0x80;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f);
      goto LAB_001b22f9;
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
    Json::Value::Value((Value *)local_3d0,4);
    Json::Value::operator=((Value *)&local_278,(Value *)local_3d0);
    Json::Value::~Value((Value *)local_3d0);
    local_3d0._0_8_ = &local_278;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) {
LAB_001b4207:
      local_338._M_unused._M_object = local_428;
      std::__throw_bad_function_call();
    }
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_388,local_3d0,&local_338);
    if (cVar5 != '\0') {
      iVar7 = 0x84;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!BoolHelper(b, &v, &state)) failed on line ",
                 0x37);
      goto LAB_001b22f9;
    }
    local_388[0] = 1;
    local_3d0._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_001b4207;
    local_338._M_unused._M_object = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                      ((anonymous_namespace)::BoolHelper,local_388,local_3d0,&local_338);
    if (cVar5 == '\0') {
      iVar7 = 0x87;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(BoolHelper(b, nullptr, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b22f9;
    }
    bVar6 = true;
    if (local_388[0] == '\x01') {
      iVar7 = 0x88;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f);
      goto LAB_001b22f9;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)&local_278);
  if (!bVar6) {
    return 1;
  }
  Json::Value::Value((Value *)&local_278,"str");
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_338._8_8_ = (char *)0x0;
  local_328 = (code *)((ulong)local_328 & 0xffffffffffffff00);
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  local_3d0._0_8_ = &local_278;
  local_338._M_unused._M_object = &local_328;
  if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b420c;
  local_388._0_8_ = local_428;
  cVar5 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_338,local_3d0,local_388);
  if (cVar5 == '\0') {
    iVar7 = 0x92;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(StringHelper(str, &v, &state)) failed on line ",
               0x3a);
LAB_001b2441:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    bVar6 = false;
  }
  else {
    iVar7 = std::__cxx11::string::compare(local_338._M_pod_data);
    if (iVar7 != 0) {
      iVar7 = 0x93;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"str\") failed on line ",0x29);
      goto LAB_001b2441;
    }
    in_R8B = 0;
    std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)local_338._8_8_,0x9ac4f5);
    Json::Value::Value((Value *)local_3d0,nullValue);
    Json::Value::operator=((Value *)&local_278,(Value *)local_3d0);
    Json::Value::~Value((Value *)local_3d0);
    local_3d0._0_8_ = &local_278;
    if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) {
LAB_001b420c:
      local_388._0_8_ = local_428;
      std::__throw_bad_function_call();
    }
    local_388._0_8_ = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                      ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_338,local_3d0,local_388
                      );
    if (cVar5 != '\0') {
      iVar7 = 0x97;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!StringHelper(str, &v, &state)) failed on line "
                 ,0x3b);
      goto LAB_001b2441;
    }
    in_R8B = 0;
    std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)local_338._8_8_,0x9ac4f5);
    local_3d0._0_8_ = (ValueHolder *)0x0;
    if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b420c;
    local_388._0_8_ = local_428;
    cVar5 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_._24_8_)
                      ((anonymous_namespace)::StringHelper_abi_cxx11_,&local_338,local_3d0,local_388
                      );
    if (cVar5 == '\0') {
      iVar7 = 0x9a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(StringHelper(str, nullptr, &state)) failed on line ",0x3f);
      goto LAB_001b2441;
    }
    iVar7 = std::__cxx11::string::compare(local_338._M_pod_data);
    if (iVar7 != 0) {
      iVar7 = 0x9b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"default\") failed on line ",0x2d);
      goto LAB_001b2441;
    }
    bVar6 = true;
  }
  if ((code **)local_338._M_unused._0_8_ != &local_328) {
    operator_delete(local_338._M_unused._M_object,(ulong)(local_328 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)&local_278);
  if (!bVar6) {
    return 1;
  }
  local_228.super__Function_base._M_functor._8_8_ = 0;
  local_228.super__Function_base._M_manager = (_Manager_type)0x0;
  local_228._M_invoker = (_Invoker_type)0x0;
  local_228.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  local_408._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_408.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_408.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_3e8._M_local_buf[0] = true;
  local_3d0._0_8_ = (code *)0x8;
  local_3d0._8_8_ = "subfield";
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_98,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
             (anonymous_namespace)::IntHelper);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<(anonymous_namespace)::ObjectStruct,int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_428,(string_view *)local_3d0,
             (offset_in_ObjectStruct_to_int)&local_98,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&DAT_00000001,
             (bool)in_R8B);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)&local_278,
             (Object<(anonymous_namespace)::ObjectStruct> *)local_428);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_408.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_408.super__Function_base._M_manager)(&local_408,&local_408,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_428);
  if (local_228.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_228.super__Function_base._M_manager)
              ((_Any_data *)&local_228,(_Any_data *)&local_228,__destroy_functor);
  }
  uStack_140 = 0;
  local_138 = (code *)0x0;
  uStack_130 = 0;
  local_148 = JsonErrors::INVALID_OBJECT;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  local_408._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_408.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_OBJECT;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_408.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_3e8._M_local_buf[0] = true;
  local_2c0.int_ = 6;
  local_2b8 = "field1";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_b8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_428,(string_view *)&local_2c0,
             (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )&local_b8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&DAT_00000001,(bool)in_R8B);
  local_190._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_190._8_8_ = "field2";
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)&local_338,
             (Object<(anonymous_namespace)::ObjectStruct> *)&local_278);
  local_378._0_8_ =
       (__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
        )0x0;
  local_378._8_8_ = (_Invoker_type)0x0;
  local_388._0_8_ = (void *)0x0;
  local_388._8_8_ = 0;
  this = (Object<(anonymous_namespace)::ObjectStruct> *)operator_new(0x48);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            (this,(Object<(anonymous_namespace)::ObjectStruct> *)&local_338);
  local_378._8_8_ =
       std::
       _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
       ::_M_invoke;
  local_378._0_8_ =
       std::
       _Function_handler<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*),_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>_>
       ::_M_manager;
  local_388._0_8_ = this;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::BindPrivate
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_428,(string_view *)local_190,
             (MemberFunction *)local_388,true);
  if ((_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       )local_378._0_8_ !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    (*(code *)local_378._0_8_)(local_388,local_388,3);
  }
  local_388._0_8_ = 6;
  local_388._8_8_ = "field3";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_d8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::
  Bind<std::__cxx11::string,std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>>
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_428,(string_view *)local_388,
             &local_d8,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&DAT_00000001,(bool)in_R8B);
  cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
            ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
             (Object<(anonymous_namespace)::ObjectStruct> *)local_428);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)&local_338);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_408.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_408.super__Function_base._M_manager)(&local_408,&local_408,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_428);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  Json::Value::Value((Value *)local_388,objectValue);
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  Json::Value::Value((Value *)&local_2c0,"Hello");
  pVVar9 = Json::Value::operator[]((Value *)local_388,"field1");
  Json::Value::operator=(pVVar9,(Value *)&local_2c0);
  Json::Value::~Value((Value *)&local_2c0);
  Json::Value::Value((Value *)&local_2c0,objectValue);
  pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
  Json::Value::operator=(pVVar9,(Value *)&local_2c0);
  Json::Value::~Value((Value *)&local_2c0);
  Json::Value::Value((Value *)&local_2c0,2);
  pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
  pVVar9 = Json::Value::operator[](pVVar9,"subfield");
  Json::Value::operator=(pVVar9,(Value *)&local_2c0);
  Json::Value::~Value((Value *)&local_2c0);
  Json::Value::Value((Value *)&local_2c0,"world!");
  pVVar9 = Json::Value::operator[]((Value *)local_388,"field3");
  Json::Value::operator=(pVVar9,(Value *)&local_2c0);
  Json::Value::~Value((Value *)&local_2c0);
  Json::Value::Value((Value *)&local_2c0,"extra");
  pVVar9 = Json::Value::operator[]((Value *)local_388,"extra");
  Json::Value::operator=(pVVar9,(Value *)&local_2c0);
  Json::Value::~Value((Value *)&local_2c0);
  local_2c0.string_ = (char *)&local_2b0;
  local_2b8 = (char *)0x0;
  local_2b0._M_local_buf[0] = '\0';
  bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                    ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                     (ObjectStruct *)&local_2c0,(Value *)local_388,(cmJSONState *)local_428);
  if (bVar6) {
    iVar7 = std::__cxx11::string::compare((char *)&local_2c0.int_);
    if (iVar7 != 0) {
      iVar7 = 0xb3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",0x31);
      goto LAB_001b2a4c;
    }
    if (local_2a0 != 2) {
      iVar7 = 0xb4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
      goto LAB_001b2a4c;
    }
    Json::Value::Value((Value *)local_190,"wrong");
    pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
    pVVar9 = Json::Value::operator[](pVVar9,"subfield");
    Json::Value::operator=(pVVar9,(Value *)local_190);
    Json::Value::~Value((Value *)local_190);
    local_190._0_8_ = &local_180;
    local_190._8_8_ = (char *)0x0;
    local_180._M_local_buf[0] = '\0';
    bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                      ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                       (ObjectStruct *)local_190,(Value *)local_388,(cmJSONState *)local_428);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ",0x34);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xb8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      bVar6 = false;
    }
    else {
      pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
      Json::Value::removeMember(pVVar9,"subfield");
      local_120.string_ = (char *)&local_110;
      local_118 = 0;
      local_110._M_local_buf[0] = '\0';
      bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                        ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                         (ObjectStruct *)&local_120,(Value *)local_388,(cmJSONState *)local_428);
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ",0x34
                  );
        poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xbc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        bVar6 = false;
      }
      else {
        Json::Value::removeMember((Value *)local_388,"field2");
        local_78.super_ObjectStruct.Field1._M_dataplus._M_p =
             (pointer)&local_78.super_ObjectStruct.Field1.field_2;
        local_78.super_ObjectStruct.Field1._M_string_length = 0;
        local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
        bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                          ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                           &local_78.super_ObjectStruct,(Value *)local_388,(cmJSONState *)local_428)
        ;
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ",
                     0x34);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xc0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          bVar6 = false;
        }
        else {
          Json::Value::Value((Value *)&local_2e8,objectValue);
          pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
          Json::Value::operator=(pVVar9,(Value *)&local_2e8);
          Json::Value::~Value((Value *)&local_2e8);
          Json::Value::Value((Value *)&local_2e8,2);
          pVVar9 = Json::Value::operator[]((Value *)local_388,"field2");
          pVVar9 = Json::Value::operator[](pVVar9,"subfield");
          Json::Value::operator=(pVVar9,(Value *)&local_2e8);
          Json::Value::~Value((Value *)&local_2e8);
          Json::Value::Value((Value *)&local_2e8,3);
          pVVar9 = Json::Value::operator[]((Value *)local_388,"field3");
          Json::Value::operator=(pVVar9,(Value *)&local_2e8);
          Json::Value::~Value((Value *)&local_2e8);
          local_2e8.string_ = (char *)&local_2d8;
          local_2e0 = 0;
          local_2d8._M_local_buf[0] = '\0';
          bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                            ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                             (ObjectStruct *)&local_2e8,(Value *)local_388,(cmJSONState *)local_428)
          ;
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ",
                       0x34);
            poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xc6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            bVar6 = false;
          }
          else {
            Json::Value::removeMember((Value *)local_388,"field3");
            local_208.Field1._M_dataplus._M_p = (pointer)&local_208.Field1.field_2;
            local_208.Field1._M_string_length = 0;
            local_208.Field1.field_2._M_allocated_capacity =
                 local_208.Field1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                              ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,&local_208,
                               (Value *)local_388,(cmJSONState *)local_428);
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ",0x34);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xca);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              bVar6 = false;
            }
            else {
              Json::Value::Value((Value *)&local_1e0,"Hello");
              Json::Value::operator=((Value *)local_388,(Value *)&local_1e0);
              Json::Value::~Value((Value *)&local_1e0);
              local_1e0._M_unused._M_object = &local_1d0;
              local_1e0._8_8_ = 0;
              local_1d0._M_local_buf[0] = '\0';
              bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                                 (ObjectStruct *)&local_1e0,(Value *)local_388,
                                 (cmJSONState *)local_428);
              if (bVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(!helper(s7, &v, &state)) failed on line ",0x34);
                poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xce);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                bVar6 = false;
              }
              else {
                local_1b8._M_unused._M_object = &local_1a8;
                local_1b8._8_8_ = 0;
                local_1a8._M_local_buf[0] = '\0';
                bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
                                  ((Object<(anonymous_namespace)::ObjectStruct> *)local_3d0,
                                   (ObjectStruct *)&local_1b8,(Value *)0x0,(cmJSONState *)local_428)
                ;
                if (bVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!helper(s8, nullptr, &state)) failed on line ",0x39);
                  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xd1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_unused._0_8_ != &local_1a8) {
                  operator_delete(local_1b8._M_unused._M_object,
                                  CONCAT71(local_1a8._M_allocated_capacity._1_7_,
                                           local_1a8._M_local_buf[0]) + 1);
                }
                bVar6 = !bVar6;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_unused._0_8_ != &local_1d0) {
                operator_delete(local_1e0._M_unused._M_object,
                                CONCAT71(local_1d0._M_allocated_capacity._1_7_,
                                         local_1d0._M_local_buf[0]) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.Field1._M_dataplus._M_p != &local_208.Field1.field_2) {
              operator_delete(local_208.Field1._M_dataplus._M_p,
                              local_208.Field1.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8.string_,
                            CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]
                                    ) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.super_ObjectStruct.Field1._M_dataplus._M_p !=
            &local_78.super_ObjectStruct.Field1.field_2) {
          operator_delete(local_78.super_ObjectStruct.Field1._M_dataplus._M_p,
                          CONCAT71(local_78.super_ObjectStruct.Field1.field_2._M_allocated_capacity.
                                   _1_7_,local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0])
                          + 1);
        }
      }
      if (local_120 != &local_110) {
        operator_delete(local_120.string_,
                        CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) +
                        1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_,
                      CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    iVar7 = 0xb2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(helper(s1, &v, &state)) failed on line ",0x33);
LAB_001b2a4c:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    bVar6 = false;
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0.string_,
                    CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)local_388);
  if (local_3a0 != (_Manager_type)0x0) {
    (*local_3a0)(&local_3b0,&local_3b0,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)local_3d0);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             *)&local_278);
  if (!bVar6) {
    return 1;
  }
  local_208.Field1._M_string_length = 0;
  local_208.Field1.field_2._M_allocated_capacity = 0;
  local_208.Field1.field_2._8_8_ = 0;
  local_208.Field1._M_dataplus._M_p =
       (pointer)anon_unknown.dwarf_bd938::ErrorMessages::InvalidObject;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  local_408._M_invoker =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_invoke;
  local_408.super__Function_base._M_functor._M_unused._M_object =
       anon_unknown.dwarf_bd938::ErrorMessages::InvalidObject;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_408.super__Function_base._M_manager =
       std::
       _Function_handler<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(*)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
       ::_M_manager;
  local_3e8._M_local_buf[0] = true;
  local_388._0_8_ = (undefined1 *)0x6;
  local_388._8_8_ = "field1";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_1e0,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)local_3d0,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)&local_1e0);
  local_3b0._M_unused._M_object = (void *)0x0;
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_328 = (code *)0x0;
  pcStack_320 = (code *)0x0;
  local_338._M_unused._M_object = operator_new(0x28);
  uVar3 = local_3c0._M_allocated_capacity;
  *(LargestInt *)local_338._M_unused._0_8_ = 0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_338._M_unused._0_8_ + 0x18) = local_3c0._8_8_;
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_338._M_unused._0_8_ = local_3d0._0_8_;
    *(undefined8 *)((long)local_338._M_unused._0_8_ + 8) = local_3d0._8_8_;
    *(size_type *)((long)local_338._M_unused._0_8_ + 0x10) = local_3c0._M_allocated_capacity;
    local_3c0._M_allocated_capacity = 0;
    local_3c0._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x20))->int_ = 0;
  pcStack_320 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_428,(string_view *)local_388,
             (MemberFunction *)&local_338,SUB81(uVar3,0));
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,3);
  }
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_3c0._M_allocated_capacity)(local_3d0,local_3d0,3);
  }
  local_2c0.int_ = 6;
  local_2b8 = "field2";
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_1b8,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
             (anonymous_namespace)::IntHelper);
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)local_3d0,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_1b8);
  local_3b0._M_unused._M_member_pointer = 0x20;
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_328 = (code *)0x0;
  pcStack_320 = (code *)0x0;
  local_338._M_unused._M_object = operator_new(0x28);
  uVar3 = local_3c0._M_allocated_capacity;
  *(LargestInt *)local_338._M_unused._0_8_ = 0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_338._M_unused._0_8_ + 0x18) = local_3c0._8_8_;
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_338._M_unused._0_8_ = local_3d0._0_8_;
    *(undefined8 *)((long)local_338._M_unused._0_8_ + 8) = local_3d0._8_8_;
    *(size_type *)((long)local_338._M_unused._0_8_ + 0x10) = local_3c0._M_allocated_capacity;
    local_3c0._M_allocated_capacity = 0;
    local_3c0._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x20))->int_ = 0x20;
  pcStack_320 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_428,(string_view *)&local_2c0,
             (MemberFunction *)&local_338,SUB81(uVar3,0));
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,3);
  }
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_3c0._M_allocated_capacity)(local_3d0,local_3d0,3);
  }
  local_190._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_190._8_8_ = "field3";
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_228,
             (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)(anonymous_namespace)::StringHelper_abi_cxx11_);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
              *)local_3d0,&local_228);
  local_3b0._M_unused._M_member_pointer = 0x28;
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_328 = (code *)0x0;
  pcStack_320 = (code *)0x0;
  local_338._M_unused._M_object = operator_new(0x28);
  uVar3 = local_3c0._M_allocated_capacity;
  *(code **)local_338._M_unused._0_8_ = (code *)0x0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 8))->int_ = 0;
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x10))->int_ = 0;
  *(undefined8 *)((long)local_338._M_unused._0_8_ + 0x18) = local_3c0._8_8_;
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    *(undefined8 *)local_338._M_unused._0_8_ = local_3d0._0_8_;
    *(undefined8 *)((long)local_338._M_unused._0_8_ + 8) = local_3d0._8_8_;
    *(size_type *)((long)local_338._M_unused._0_8_ + 0x10) = local_3c0._M_allocated_capacity;
    local_3c0._M_allocated_capacity = 0;
    local_3c0._8_8_ = (code *)0x0;
  }
  ((ValueHolder *)((long)local_338._M_unused._0_8_ + 0x20))->int_ = 0x28;
  pcStack_320 = std::
                _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<bool_((anonymous_namespace)::InheritedStruct_&,_const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.h:81:9)>
              ::_M_manager;
  name = (_Any_data *)local_190;
  cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
            ((Object<(anonymous_namespace)::InheritedStruct> *)local_428,(string_view *)name,
             (MemberFunction *)&local_338,SUB81(uVar3,0));
  if (local_328 != (code *)0x0) {
    name = &local_338;
    (*local_328)(name,name,3);
  }
  if ((code *)local_3c0._M_allocated_capacity != (code *)0x0) {
    name = (_Any_data *)local_3d0;
    (*(code *)local_3c0._M_allocated_capacity)(name,name,3);
  }
  lVar11 = CONCAT71(local_428._9_7_,local_428[8]) - local_428._0_8_;
  local_278.int_ = 0;
  VStack_270 = (ValueHolder)0x0;
  local_268 = (char *)0x0;
  VVar10.map_ = (ObjectValues *)
                std::
                _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                ::_M_allocate((_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                               *)((lVar11 >> 3) * 0x6db6db6db6db6db7),(size_t)name);
  local_268 = VVar10.string_ + lVar11;
  pMVar2 = (pointer)CONCAT71(local_428._9_7_,local_428[8]);
  local_278.map_ = VVar10.map_;
  VStack_270.map_ = VVar10.map_;
  for (pMVar12 = (pointer)local_428._0_8_; pMVar12 != pMVar2; pMVar12 = pMVar12 + 1) {
    pcVar1 = (char *)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pMVar12->Name)->_M_string_length;
    *(pointer *)VVar10.string_ =
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pMVar12->Name)->
         _M_dataplus)._M_p;
    *(char **)&((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = pcVar1;
    ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar12->Function)[1]._M_allocated_capacity != (code *)0x0) {
      (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar12->Function)[1]._M_allocated_capacity)
                (&((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar12->Function,2);
      ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
           *(size_t *)((long)&pMVar12->Function + 0x18);
      ((VVar10.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&pMVar12->Function)[1]._M_allocated_capacity;
    }
    *(bool *)(VVar10.int_ + 0x30) = pMVar12->Required;
    VVar10.string_ = (char *)(VVar10.int_ + 0x38);
  }
  VStack_270 = VVar10;
  local_260 = abStack_410[0];
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_258,&local_408);
  local_238 = local_3e8._M_local_buf[0];
  if (local_228.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_228.super__Function_base._M_manager)
              ((_Any_data *)&local_228,(_Any_data *)&local_228,__destroy_functor);
  }
  if ((code *)CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) !=
      (code *)0x0) {
    (*(code *)CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]))
              (&local_1b8,&local_1b8,3);
  }
  if ((code *)CONCAT71(local_1d0._M_allocated_capacity._1_7_,local_1d0._M_local_buf[0]) !=
      (code *)0x0) {
    (*(code *)CONCAT71(local_1d0._M_allocated_capacity._1_7_,local_1d0._M_local_buf[0]))
              (&local_1e0,&local_1e0,3);
  }
  if (local_408.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_408.super__Function_base._M_manager)(&local_408,&local_408,3);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
             *)local_428);
  if ((code *)local_208.Field1.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_208.Field1.field_2._M_allocated_capacity)(&local_208,&local_208,3);
  }
  Json::Value::Value((Value *)&local_2e8,objectValue);
  local_408.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_408.super__Function_base._M_functor._8_8_ = 0;
  local_428[0x10] = 0;
  local_428._17_7_ = 0;
  abStack_410[0] = false;
  abStack_410[1] = false;
  abStack_410[2] = false;
  abStack_410[3] = false;
  abStack_410[4] = false;
  abStack_410[5] = false;
  abStack_410[6] = false;
  abStack_410[7] = false;
  local_428._0_8_ = (pointer)0x0;
  local_428[8] = 0;
  local_428._9_7_ = 0;
  local_408._M_invoker = (_Invoker_type)0x0;
  local_3e8._M_local_buf[0] = false;
  local_408.super__Function_base._M_manager = (_Manager_type)&local_3e8;
  Json::Value::Value((Value *)local_3d0,"Hello");
  pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field1");
  Json::Value::operator=(pVVar9,(Value *)local_3d0);
  Json::Value::~Value((Value *)local_3d0);
  Json::Value::Value((Value *)local_3d0,2);
  pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field2");
  Json::Value::operator=(pVVar9,(Value *)local_3d0);
  Json::Value::~Value((Value *)local_3d0);
  Json::Value::Value((Value *)local_3d0,"world!");
  pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field3");
  Json::Value::operator=(pVVar9,(Value *)local_3d0);
  Json::Value::~Value((Value *)local_3d0);
  Json::Value::Value((Value *)local_3d0,"extra");
  pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"extra");
  Json::Value::operator=(pVVar9,(Value *)local_3d0);
  Json::Value::~Value((Value *)local_3d0);
  local_3d0._0_8_ = &local_3c0;
  local_3d0._8_8_ = (pointer)0x0;
  local_3c0._M_allocated_capacity = local_3c0._M_allocated_capacity & 0xffffffffffffff00;
  local_3a0 = (_Manager_type)0x0;
  local_398._M_local_buf[0] = '\0';
  local_3b0._8_8_ = &local_398;
  bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                    ((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                     (InheritedStruct *)local_3d0,(Value *)&local_2e8,(cmJSONState *)local_428);
  if (bVar6) {
    iVar7 = std::__cxx11::string::compare(local_3d0);
    if (iVar7 == 0) {
      if (local_3b0._0_4_ == 2) {
        iVar7 = std::__cxx11::string::compare(local_3b0._M_pod_data + 8);
        if (iVar7 == 0) {
          Json::Value::Value((Value *)&local_338,"wrong");
          pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field2");
          Json::Value::operator=(pVVar9,(Value *)&local_338);
          Json::Value::~Value((Value *)&local_338);
          local_338._8_8_ = 0;
          local_328 = (code *)((ulong)local_328 & 0xffffffffffffff00);
          local_318._8_8_ = &local_300;
          local_308 = (code *)0x0;
          local_300._M_local_buf[0] = '\0';
          local_338._M_unused._M_object = &local_328;
          bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                            ((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                             (InheritedStruct *)&local_338,(Value *)&local_2e8,
                             (cmJSONState *)local_428);
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(!helper(s2, &v, &state)) failed on line ",
                       0x34);
            poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xee);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            bVar6 = false;
          }
          else {
            Json::Value::removeMember((Value *)&local_2e8,"field2");
            local_388._0_8_ = local_378;
            local_388._8_8_ = (char *)0x0;
            local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
            local_360._M_p = (pointer)&local_350;
            local_358 = 0;
            local_350._M_local_buf[0] = '\0';
            bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::operator()
                              ((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                               (InheritedStruct *)local_388,(Value *)&local_2e8,
                               (cmJSONState *)local_428);
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!helper(s3, &v, &state)) failed on line ",0x34);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xf2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              bVar6 = false;
            }
            else {
              Json::Value::Value((Value *)&local_2c0,2);
              pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field2");
              Json::Value::operator=(pVVar9,(Value *)&local_2c0);
              Json::Value::~Value((Value *)&local_2c0);
              Json::Value::Value((Value *)&local_2c0,3);
              pVVar9 = Json::Value::operator[]((Value *)&local_2e8,"field3");
              Json::Value::operator=(pVVar9,(Value *)&local_2c0);
              Json::Value::~Value((Value *)&local_2c0);
              local_2c0.string_ = (char *)&local_2b0;
              local_2b8 = (char *)0x0;
              local_2b0._M_local_buf[0] = '\0';
              local_298 = &local_288;
              local_290 = 0;
              local_288._M_local_buf[0] = '\0';
              bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                      operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                                 (InheritedStruct *)&local_2c0,(Value *)&local_2e8,
                                 (cmJSONState *)local_428);
              if (bVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(!helper(s4, &v, &state)) failed on line ",0x34);
                poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xf7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                bVar6 = false;
              }
              else {
                Json::Value::removeMember((Value *)&local_2e8,"field3");
                local_190._0_8_ = &local_180;
                local_190._8_8_ = (char *)0x0;
                local_180._M_local_buf[0] = '\0';
                local_168._M_p = (pointer)&local_158;
                local_160 = 0;
                local_158._M_local_buf[0] = '\0';
                bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                        operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                                   (InheritedStruct *)local_190,(Value *)&local_2e8,
                                   (cmJSONState *)local_428);
                if (bVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!helper(s5, &v, &state)) failed on line ",0x34);
                  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xfb);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                  bVar6 = false;
                }
                else {
                  Json::Value::Value((Value *)&local_120,"Hello");
                  Json::Value::operator=((Value *)&local_2e8,(Value *)&local_120);
                  Json::Value::~Value((Value *)&local_120);
                  local_120.string_ = (char *)&local_110;
                  local_118 = 0;
                  local_110._M_local_buf[0] = '\0';
                  local_f8 = &local_e8;
                  local_f0 = 0;
                  local_e8._M_local_buf[0] = '\0';
                  bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                          operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                                     (InheritedStruct *)&local_120,(Value *)&local_2e8,
                                     (cmJSONState *)local_428);
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(!helper(s6, &v, &state)) failed on line ",0x34);
                    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0xff);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    bVar6 = false;
                  }
                  else {
                    local_78.super_ObjectStruct.Field1._M_dataplus._M_p =
                         (pointer)&local_78.super_ObjectStruct.Field1.field_2;
                    local_78.super_ObjectStruct.Field1._M_string_length = 0;
                    local_78.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
                    local_78.Field3._M_dataplus._M_p = (pointer)&local_78.Field3.field_2;
                    local_78.Field3._M_string_length = 0;
                    local_78.Field3.field_2._M_local_buf[0] = '\0';
                    bVar6 = cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::
                            operator()((Object<(anonymous_namespace)::InheritedStruct> *)&local_278,
                                       &local_78,(Value *)0x0,(cmJSONState *)local_428);
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(!helper(s7, nullptr, &state)) failed on line ",0x39);
                      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0x102);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    }
                    bVar6 = !bVar6;
                    anon_unknown.dwarf_bd938::InheritedStruct::~InheritedStruct(&local_78);
                  }
                  anon_unknown.dwarf_bd938::InheritedStruct::~InheritedStruct
                            ((InheritedStruct *)&local_120);
                }
                anon_unknown.dwarf_bd938::InheritedStruct::~InheritedStruct
                          ((InheritedStruct *)local_190);
              }
              anon_unknown.dwarf_bd938::InheritedStruct::~InheritedStruct
                        ((InheritedStruct *)&local_2c0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_p != &local_350) {
              operator_delete(local_360._M_p,
                              CONCAT71(local_350._M_allocated_capacity._1_7_,
                                       local_350._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_388._0_8_ != local_378) {
              operator_delete((void *)local_388._0_8_,(ulong)(local_378._0_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._8_8_ != &local_300) {
            operator_delete((void *)local_318._8_8_,
                            CONCAT71(local_300._M_allocated_capacity._1_7_,local_300._M_local_buf[0]
                                    ) + 1);
          }
          if ((code **)local_338._M_unused._0_8_ != &local_328) {
            operator_delete(local_338._M_unused._M_object,(ulong)(local_328 + 1));
          }
          goto LAB_001b34f3;
        }
        iVar7 = 0xea;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field3 == \"world!\") failed on line ",0x32
                  );
      }
      else {
        iVar7 = 0xe9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
      }
    }
    else {
      iVar7 = 0xe8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",0x31);
    }
  }
  else {
    iVar7 = 0xe7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(helper(s1, &v, &state)) failed on line ",0x33);
  }
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  bVar6 = false;
LAB_001b34f3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._8_8_ != &local_398) {
    operator_delete((void *)local_3b0._8_8_,
                    CONCAT71(local_398._M_allocated_capacity._1_7_,local_398._M_local_buf[0]) + 1);
  }
  uVar13 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != &local_3c0) {
    operator_delete((void *)local_3d0._0_8_,(ulong)(local_3c0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super__Function_base._M_manager != &local_3e8) {
    operator_delete(local_408.super__Function_base._M_manager,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector
            ((vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> *)abStack_410);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
             *)local_428);
  Json::Value::~Value((Value *)&local_2e8);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
             *)&local_278);
  if (((((bVar6) && (bVar6 = anon_unknown.dwarf_bd938::testObjectNoExtra(), bVar6)) &&
       (bVar6 = anon_unknown.dwarf_bd938::testObjectOptional(), bVar6)) &&
      ((bVar6 = anon_unknown.dwarf_bd938::testVector(), bVar6 &&
       (bVar6 = anon_unknown.dwarf_bd938::testVectorFilter(), bVar6)))) &&
     ((bVar6 = anon_unknown.dwarf_bd938::testMap(), bVar6 &&
      ((bVar6 = anon_unknown.dwarf_bd938::testMapFilter(), bVar6 &&
       (bVar6 = anon_unknown.dwarf_bd938::testOptional(), bVar6)))))) {
    bVar6 = anon_unknown.dwarf_bd938::testRequired();
    uVar13 = (uint)!bVar6;
  }
  return uVar13;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/[])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}